

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,string *fromFile)

{
  cmExecutionStatus *this_00;
  ostream *poVar1;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream e;
  string *fromFile_local;
  cmFileCopier *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,this->Name);
  poVar1 = std::operator<<(poVar1," cannot find \"");
  poVar1 = std::operator<<(poVar1,(string *)fromFile);
  poVar1 = std::operator<<(poVar1,"\": ");
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_1c0);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string(local_1c0);
  this_00 = this->Status;
  std::__cxx11::ostringstream::str();
  cmExecutionStatus::SetError(this_00,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

bool cmFileCopier::ReportMissing(const std::string& fromFile)
{
  // The input file does not exist and installation is not optional.
  std::ostringstream e;
  e << this->Name << " cannot find \"" << fromFile
    << "\": " << cmSystemTools::GetLastSystemError() << ".";
  this->Status.SetError(e.str());
  return false;
}